

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Image_Function_Helper::Histogram
          (HistogramForm4 histogram,Image *image,uint32_t x,uint32_t y,uint32_t width,
          uint32_t height)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  code *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  undefined4 in_R8D;
  uint32_t in_R9D;
  undefined4 in_stack_00000008;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *histogramTable;
  uint32_t in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  uint32_t in_stack_ffffffffffffffd8;
  
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_ECX,in_R8D),in_R9D,
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10e51b);
  (*in_RSI)(in_RDX,in_ECX,in_R8D,in_R9D,in_stack_00000008,in_RDI);
  return in_RDI;
}

Assistant:

std::vector < uint32_t > Histogram( FunctionTable::HistogramForm4 histogram,
                                        const Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height )
    {
        Image_Function::ParameterValidation( image, x, y, width, height );

        std::vector < uint32_t > histogramTable;

        histogram( image, x, y, width, height, histogramTable );

        return histogramTable;
    }